

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O0

void nn_binproc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  void *pvVar1;
  nn_list *self_00;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_sinproc *sinproc;
  nn_sinproc *peer;
  nn_binproc *binproc;
  nn_sinproc *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  nn_ep *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  int src_00;
  int iVar2;
  long local_38;
  
  src_00 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_38 = in_RDI;
  if (in_RDI == 0) {
    local_38 = 0;
  }
  iVar2 = *(int *)(local_38 + 0x58);
  if (iVar2 == 1) {
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
              ,0xce);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_38 + 0x58),0xfffffffe,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
              ,0xca);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)(local_38 + 0x58) = 2;
  }
  else {
    if (iVar2 != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
              ,0xfd);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_ESI == 1) {
      if (in_EDX == 6) {
        nn_sinproc_stop((nn_sinproc *)0x1e50f1);
      }
      else if (in_EDX == 7) {
        nn_list_erase((nn_list *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (nn_list_item *)in_stack_ffffffffffffff98);
        nn_sinproc_term((nn_sinproc *)0x1e50d8);
        nn_free((void *)0x1e50e2);
      }
    }
    else {
      if (in_ESI != 0x6c41) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
                ,0xf6);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_38 + 0x58),0x6c41,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
                ,0xe4);
        fflush(_stderr);
        nn_err_abort();
      }
      pvVar1 = nn_alloc_(0x1e4f5e);
      if (pvVar1 == (void *)0x0) {
        nn_backtrace_print();
        fprintf(_stderr,"Out of memory (%s:%d)\n",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
                ,0xdc);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_sinproc_init((nn_sinproc *)CONCAT44(iVar2,in_ESI),src_00,in_stack_ffffffffffffffb0,
                      (nn_fsm *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      self_00 = (nn_list *)(local_38 + 0x80);
      nn_list_end((nn_list *)(local_38 + 0x80));
      nn_list_insert(self_00,(nn_list_item *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (nn_list_item *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      nn_sinproc_accept((nn_sinproc *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

static void nn_binproc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_binproc *binproc;
    struct nn_sinproc *peer;
    struct nn_sinproc *sinproc;

    binproc = nn_cont (self, struct nn_binproc, fsm);

    switch (binproc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BINPROC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                binproc->state = NN_BINPROC_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (binproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (binproc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_BINPROC_STATE_ACTIVE:
        switch (src) {

        case NN_SINPROC_SRC_PEER:
            switch (type) {
            case NN_SINPROC_CONNECT:
                peer = (struct nn_sinproc*) srcptr;
                sinproc = nn_alloc (sizeof (struct nn_sinproc), "sinproc");
                alloc_assert (sinproc);
                nn_sinproc_init (sinproc, NN_BINPROC_SRC_SINPROC,
                    binproc->item.ep, &binproc->fsm);
                nn_list_insert (&binproc->sinprocs, &sinproc->item,
                    nn_list_end (&binproc->sinprocs));
                nn_sinproc_accept (sinproc, peer);
                return;
            default:
                nn_fsm_bad_action (binproc->state, src, type);
            }

        case NN_BINPROC_SRC_SINPROC:
            sinproc = srcptr;
            switch (type) {
            case NN_SINPROC_STOPPED:
                nn_list_erase (&binproc->sinprocs, &sinproc->item);
                nn_sinproc_term (sinproc);
                nn_free (sinproc);
                return;
            case NN_SINPROC_DISCONNECT:
                nn_sinproc_stop (sinproc);
                return;
            }
            return;

        default:
            nn_fsm_bad_source (binproc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (binproc->state, src, type);
    }
}